

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

void sq_settop(HSQUIRRELVM v,SQInteger newtop)

{
  long nelemstopop;
  long lVar1;
  HSQUIRRELVM in_RSI;
  HSQUIRRELVM in_RDI;
  SQInteger top;
  
  nelemstopop = sq_gettop(in_RDI);
  if ((long)in_RSI < nelemstopop) {
    sq_pop(in_RSI,nelemstopop);
  }
  else {
    while (lVar1 = nelemstopop + 1, nelemstopop < (long)in_RSI) {
      sq_pushnull((HSQUIRRELVM)0x10b3ee);
      nelemstopop = lVar1;
    }
  }
  return;
}

Assistant:

void sq_settop(HSQUIRRELVM v, SQInteger newtop)
{
    SQInteger top = sq_gettop(v);
    if(top > newtop)
        sq_pop(v, top - newtop);
    else
        while(top++ < newtop) sq_pushnull(v);
}